

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void wstran_dialer_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  return;
}

Assistant:

static void
wstran_dialer_cancel(nni_aio *aio, void *arg, int rv)
{
	ws_dialer *d = arg;

	nni_mtx_lock(&d->mtx);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&d->mtx);
}